

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O3

string * __thiscall
OpenMPUsesAllocatorsClause::toString_abi_cxx11_
          (string *__return_storage_ptr__,OpenMPUsesAllocatorsClause *this)

{
  usesAllocatorParameter *puVar1;
  pointer pcVar2;
  long *plVar3;
  string *psVar4;
  int iVar5;
  pointer ppuVar6;
  undefined8 uVar7;
  uint uVar8;
  ulong uVar9;
  string parameter_string;
  long *local_80 [2];
  long local_70 [2];
  string *local_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"uses_allocators ","");
  local_58 = &local_48;
  local_50 = 0;
  local_48 = 0;
  local_60 = __return_storage_ptr__;
  std::__cxx11::string::append((char *)&local_58);
  ppuVar6 = (this->usesAllocatorsAllocatorSequence).
            super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->usesAllocatorsAllocatorSequence).
      super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>.
      _M_impl.super__Vector_impl_data._M_finish == ppuVar6) {
LAB_0017f187:
    psVar4 = local_60;
    std::__cxx11::string::_M_append((char *)local_60,(ulong)local_58);
    std::__cxx11::string::append((char *)psVar4);
    if (local_58 != &local_48) {
      operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
    }
    return psVar4;
  }
  uVar8 = 1;
  uVar9 = 0;
LAB_0017e846:
  puVar1 = ppuVar6[uVar9];
  switch(puVar1->allocator) {
  case OMPC_USESALLOCATORS_ALLOCATOR_default:
    std::__cxx11::string::append((char *)&local_58);
    ppuVar6 = (this->usesAllocatorsAllocatorSequence).
              super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->usesAllocatorsAllocatorSequence).
                      super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppuVar6 >> 3) <= uVar9)
    goto LAB_0017f263;
    puVar1 = ppuVar6[uVar9];
    pcVar2 = (puVar1->allocator_traits_array)._M_dataplus._M_p;
    local_80[0] = local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_80,pcVar2,pcVar2 + (puVar1->allocator_traits_array)._M_string_length)
    ;
    iVar5 = std::__cxx11::string::compare((char *)local_80);
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
    if (iVar5 == 0) {
LAB_0017f147:
      if (uVar9 < ((long)(this->usesAllocatorsAllocatorSequence).
                         super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->usesAllocatorsAllocatorSequence).
                         super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U) {
        std::__cxx11::string::append((char *)&local_58);
      }
      goto switchD_0017e864_default;
    }
    std::__cxx11::string::append((char *)&local_58);
    ppuVar6 = (this->usesAllocatorsAllocatorSequence).
              super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (uVar9 < (ulong)((long)(this->usesAllocatorsAllocatorSequence).
                              super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppuVar6 >> 3)) {
      puVar1 = ppuVar6[uVar9];
      pcVar2 = (puVar1->allocator_traits_array)._M_dataplus._M_p;
      local_80[0] = local_70;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_80,pcVar2,
                 pcVar2 + (puVar1->allocator_traits_array)._M_string_length);
      std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_80[0]);
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
      std::__cxx11::string::append((char *)&local_58);
      goto LAB_0017f147;
    }
    goto LAB_0017f2b8;
  case OMPC_USESALLOCATORS_ALLOCATOR_large_cap:
    std::__cxx11::string::append((char *)&local_58);
    ppuVar6 = (this->usesAllocatorsAllocatorSequence).
              super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->usesAllocatorsAllocatorSequence).
                      super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppuVar6 >> 3) <= uVar9)
    goto LAB_0017f252;
    puVar1 = ppuVar6[uVar9];
    pcVar2 = (puVar1->allocator_traits_array)._M_dataplus._M_p;
    local_80[0] = local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_80,pcVar2,pcVar2 + (puVar1->allocator_traits_array)._M_string_length)
    ;
    iVar5 = std::__cxx11::string::compare((char *)local_80);
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
    if (iVar5 == 0) goto LAB_0017f147;
    std::__cxx11::string::append((char *)&local_58);
    ppuVar6 = (this->usesAllocatorsAllocatorSequence).
              super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (uVar9 < (ulong)((long)(this->usesAllocatorsAllocatorSequence).
                              super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppuVar6 >> 3)) {
      puVar1 = ppuVar6[uVar9];
      pcVar2 = (puVar1->allocator_traits_array)._M_dataplus._M_p;
      local_80[0] = local_70;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_80,pcVar2,
                 pcVar2 + (puVar1->allocator_traits_array)._M_string_length);
      std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_80[0]);
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
      std::__cxx11::string::append((char *)&local_58);
      goto LAB_0017f147;
    }
    goto LAB_0017f2a7;
  case OMPC_USESALLOCATORS_ALLOCATOR_cons_mem:
    std::__cxx11::string::append((char *)&local_58);
    ppuVar6 = (this->usesAllocatorsAllocatorSequence).
              super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->usesAllocatorsAllocatorSequence).
                      super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppuVar6 >> 3) <= uVar9)
    goto LAB_0017f241;
    puVar1 = ppuVar6[uVar9];
    pcVar2 = (puVar1->allocator_traits_array)._M_dataplus._M_p;
    local_80[0] = local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_80,pcVar2,pcVar2 + (puVar1->allocator_traits_array)._M_string_length)
    ;
    iVar5 = std::__cxx11::string::compare((char *)local_80);
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
    if (iVar5 == 0) goto LAB_0017f147;
    std::__cxx11::string::append((char *)&local_58);
    ppuVar6 = (this->usesAllocatorsAllocatorSequence).
              super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (uVar9 < (ulong)((long)(this->usesAllocatorsAllocatorSequence).
                              super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppuVar6 >> 3)) {
      puVar1 = ppuVar6[uVar9];
      pcVar2 = (puVar1->allocator_traits_array)._M_dataplus._M_p;
      local_80[0] = local_70;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_80,pcVar2,
                 pcVar2 + (puVar1->allocator_traits_array)._M_string_length);
      std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_80[0]);
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
      std::__cxx11::string::append((char *)&local_58);
      goto LAB_0017f147;
    }
    goto LAB_0017f296;
  case OMPC_USESALLOCATORS_ALLOCATOR_high_bw:
    std::__cxx11::string::append((char *)&local_58);
    ppuVar6 = (this->usesAllocatorsAllocatorSequence).
              super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->usesAllocatorsAllocatorSequence).
                      super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppuVar6 >> 3) <= uVar9)
    goto LAB_0017f230;
    puVar1 = ppuVar6[uVar9];
    pcVar2 = (puVar1->allocator_traits_array)._M_dataplus._M_p;
    local_80[0] = local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_80,pcVar2,pcVar2 + (puVar1->allocator_traits_array)._M_string_length)
    ;
    iVar5 = std::__cxx11::string::compare((char *)local_80);
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
    if (iVar5 == 0) goto LAB_0017f147;
    std::__cxx11::string::append((char *)&local_58);
    ppuVar6 = (this->usesAllocatorsAllocatorSequence).
              super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (uVar9 < (ulong)((long)(this->usesAllocatorsAllocatorSequence).
                              super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppuVar6 >> 3)) {
      puVar1 = ppuVar6[uVar9];
      pcVar2 = (puVar1->allocator_traits_array)._M_dataplus._M_p;
      local_80[0] = local_70;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_80,pcVar2,
                 pcVar2 + (puVar1->allocator_traits_array)._M_string_length);
      std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_80[0]);
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
      std::__cxx11::string::append((char *)&local_58);
      goto LAB_0017f147;
    }
    goto LAB_0017f285;
  case OMPC_USESALLOCATORS_ALLOCATOR_low_lat:
    std::__cxx11::string::append((char *)&local_58);
    ppuVar6 = (this->usesAllocatorsAllocatorSequence).
              super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->usesAllocatorsAllocatorSequence).
                      super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppuVar6 >> 3) <= uVar9)
    goto LAB_0017f21f;
    puVar1 = ppuVar6[uVar9];
    pcVar2 = (puVar1->allocator_traits_array)._M_dataplus._M_p;
    local_80[0] = local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_80,pcVar2,pcVar2 + (puVar1->allocator_traits_array)._M_string_length)
    ;
    iVar5 = std::__cxx11::string::compare((char *)local_80);
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
    if (iVar5 == 0) goto LAB_0017f147;
    std::__cxx11::string::append((char *)&local_58);
    ppuVar6 = (this->usesAllocatorsAllocatorSequence).
              super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (uVar9 < (ulong)((long)(this->usesAllocatorsAllocatorSequence).
                              super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppuVar6 >> 3)) {
      puVar1 = ppuVar6[uVar9];
      pcVar2 = (puVar1->allocator_traits_array)._M_dataplus._M_p;
      local_80[0] = local_70;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_80,pcVar2,
                 pcVar2 + (puVar1->allocator_traits_array)._M_string_length);
      std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_80[0]);
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
      std::__cxx11::string::append((char *)&local_58);
      goto LAB_0017f147;
    }
    break;
  case OMPC_USESALLOCATORS_ALLOCATOR_cgroup:
    std::__cxx11::string::append((char *)&local_58);
    ppuVar6 = (this->usesAllocatorsAllocatorSequence).
              super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (uVar9 < (ulong)((long)(this->usesAllocatorsAllocatorSequence).
                              super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppuVar6 >> 3)) {
      puVar1 = ppuVar6[uVar9];
      pcVar2 = (puVar1->allocator_traits_array)._M_dataplus._M_p;
      local_80[0] = local_70;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_80,pcVar2,
                 pcVar2 + (puVar1->allocator_traits_array)._M_string_length);
      iVar5 = std::__cxx11::string::compare((char *)local_80);
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
      if (iVar5 != 0) {
        std::__cxx11::string::append((char *)&local_58);
        ppuVar6 = (this->usesAllocatorsAllocatorSequence).
                  super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->usesAllocatorsAllocatorSequence).
                          super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppuVar6 >> 3) <= uVar9)
        goto LAB_0017f2fc;
        puVar1 = ppuVar6[uVar9];
        pcVar2 = (puVar1->allocator_traits_array)._M_dataplus._M_p;
        local_80[0] = local_70;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_80,pcVar2,
                   pcVar2 + (puVar1->allocator_traits_array)._M_string_length);
        std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_80[0]);
        if (local_80[0] != local_70) {
          operator_delete(local_80[0],local_70[0] + 1);
        }
        std::__cxx11::string::append((char *)&local_58);
      }
      goto LAB_0017f147;
    }
LAB_0017f20e:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9);
LAB_0017f21f:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9);
LAB_0017f230:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9);
LAB_0017f241:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9);
LAB_0017f252:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9);
LAB_0017f263:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9);
    break;
  case OMPC_USESALLOCATORS_ALLOCATOR_pteam:
    std::__cxx11::string::append((char *)&local_58);
    ppuVar6 = (this->usesAllocatorsAllocatorSequence).
              super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->usesAllocatorsAllocatorSequence).
                      super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppuVar6 >> 3) <= uVar9) {
LAB_0017f1fd:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9);
      goto LAB_0017f20e;
    }
    puVar1 = ppuVar6[uVar9];
    pcVar2 = (puVar1->allocator_traits_array)._M_dataplus._M_p;
    local_80[0] = local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_80,pcVar2,pcVar2 + (puVar1->allocator_traits_array)._M_string_length)
    ;
    iVar5 = std::__cxx11::string::compare((char *)local_80);
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
    if (iVar5 == 0) goto LAB_0017f147;
    std::__cxx11::string::append((char *)&local_58);
    ppuVar6 = (this->usesAllocatorsAllocatorSequence).
              super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (uVar9 < (ulong)((long)(this->usesAllocatorsAllocatorSequence).
                              super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppuVar6 >> 3)) {
      puVar1 = ppuVar6[uVar9];
      pcVar2 = (puVar1->allocator_traits_array)._M_dataplus._M_p;
      local_80[0] = local_70;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_80,pcVar2,
                 pcVar2 + (puVar1->allocator_traits_array)._M_string_length);
      std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_80[0]);
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
      std::__cxx11::string::append((char *)&local_58);
      goto LAB_0017f147;
    }
    goto LAB_0017f2eb;
  case OMPC_USESALLOCATORS_ALLOCATOR_thread:
    std::__cxx11::string::append((char *)&local_58);
    ppuVar6 = (this->usesAllocatorsAllocatorSequence).
              super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->usesAllocatorsAllocatorSequence).
                      super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppuVar6 >> 3) <= uVar9) {
LAB_0017f1ec:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9);
      goto LAB_0017f1fd;
    }
    puVar1 = ppuVar6[uVar9];
    pcVar2 = (puVar1->allocator_traits_array)._M_dataplus._M_p;
    local_80[0] = local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_80,pcVar2,pcVar2 + (puVar1->allocator_traits_array)._M_string_length)
    ;
    iVar5 = std::__cxx11::string::compare((char *)local_80);
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
    if (iVar5 == 0) goto LAB_0017f147;
    std::__cxx11::string::append((char *)&local_58);
    ppuVar6 = (this->usesAllocatorsAllocatorSequence).
              super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (uVar9 < (ulong)((long)(this->usesAllocatorsAllocatorSequence).
                              super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppuVar6 >> 3)) {
      puVar1 = ppuVar6[uVar9];
      pcVar2 = (puVar1->allocator_traits_array)._M_dataplus._M_p;
      local_80[0] = local_70;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_80,pcVar2,
                 pcVar2 + (puVar1->allocator_traits_array)._M_string_length);
      std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_80[0]);
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
      std::__cxx11::string::append((char *)&local_58);
      goto LAB_0017f147;
    }
    goto LAB_0017f2da;
  case OMPC_USESALLOCATORS_ALLOCATOR_user:
    pcVar2 = (puVar1->allocator_user)._M_dataplus._M_p;
    local_80[0] = local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_80,pcVar2,pcVar2 + (puVar1->allocator_user)._M_string_length);
    std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_80[0]);
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
    ppuVar6 = (this->usesAllocatorsAllocatorSequence).
              super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->usesAllocatorsAllocatorSequence).
                      super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppuVar6 >> 3) <= uVar9) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9);
      goto LAB_0017f1ec;
    }
    puVar1 = ppuVar6[uVar9];
    pcVar2 = (puVar1->allocator_traits_array)._M_dataplus._M_p;
    local_80[0] = local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_80,pcVar2,pcVar2 + (puVar1->allocator_traits_array)._M_string_length)
    ;
    iVar5 = std::__cxx11::string::compare((char *)local_80);
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
    if (iVar5 == 0) goto LAB_0017f147;
    std::__cxx11::string::append((char *)&local_58);
    ppuVar6 = (this->usesAllocatorsAllocatorSequence).
              super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (uVar9 < (ulong)((long)(this->usesAllocatorsAllocatorSequence).
                              super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppuVar6 >> 3)) {
      puVar1 = ppuVar6[uVar9];
      pcVar2 = (puVar1->allocator_traits_array)._M_dataplus._M_p;
      local_80[0] = local_70;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_80,pcVar2,
                 pcVar2 + (puVar1->allocator_traits_array)._M_string_length);
      std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_80[0]);
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
      std::__cxx11::string::append((char *)&local_58);
      goto LAB_0017f147;
    }
    goto LAB_0017f2c9;
  default:
    goto switchD_0017e864_default;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9);
LAB_0017f285:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9);
LAB_0017f296:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9);
LAB_0017f2a7:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9);
LAB_0017f2b8:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9);
LAB_0017f2c9:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9);
LAB_0017f2da:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9);
LAB_0017f2eb:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9);
LAB_0017f2fc:
  uVar7 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar9);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] + 1);
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  plVar3 = (long *)(local_60->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar3 != local_38) {
    operator_delete(plVar3,local_38->_M_allocated_capacity + 1);
  }
  _Unwind_Resume(uVar7);
switchD_0017e864_default:
  uVar9 = (ulong)uVar8;
  ppuVar6 = (this->usesAllocatorsAllocatorSequence).
            super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar8 = uVar8 + 1;
  if ((ulong)((long)(this->usesAllocatorsAllocatorSequence).
                    super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppuVar6 >> 3) <= uVar9)
  goto LAB_0017f187;
  goto LAB_0017e846;
}

Assistant:

std::string OpenMPUsesAllocatorsClause::toString() {
    std::vector<usesAllocatorParameter*>* usesAllocatorsAllocatorSequence = this->getUsesAllocatorsAllocatorSequence();
    std::string result = "uses_allocators ";
    std::string parameter_string;
    parameter_string += "(";
    for (unsigned int i = 0; i < usesAllocatorsAllocatorSequence->size(); i++) {
        switch (usesAllocatorsAllocatorSequence->at(i)->getUsesAllocatorsAllocator()) {
            case OMPC_USESALLOCATORS_ALLOCATOR_default: {
                parameter_string += "omp_default_mem_alloc";
                if (usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray() != "") {
                    parameter_string += "(";
                    parameter_string += usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray();
                    parameter_string += ")";
                }
                if (i < usesAllocatorsAllocatorSequence->size()-1) {
                    parameter_string += ",";
                }
            }
            break;
            case OMPC_USESALLOCATORS_ALLOCATOR_large_cap: {
                parameter_string += "omp_large_cap_mem_alloc";
                if (usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray() != "") {
                    parameter_string += "(";
                    parameter_string += usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray();
                    parameter_string += ")";
                }
                if (i < usesAllocatorsAllocatorSequence->size()-1) {
                    parameter_string += ",";
                }
            }
            break;
            case OMPC_USESALLOCATORS_ALLOCATOR_cons_mem: {
                parameter_string += "omp_const_mem_alloc";
                if (usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray() != "") {
                    parameter_string += "(";
                    parameter_string += usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray();
                    parameter_string += ")";
                }
                if (i < usesAllocatorsAllocatorSequence->size()-1) {
                    parameter_string += ",";
                }
            }
            break;
            case OMPC_USESALLOCATORS_ALLOCATOR_high_bw: {
                parameter_string += "omp_high_bw_mem_alloc";
                if (usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray() != "") {
                    parameter_string += "(";
                    parameter_string += usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray();
                    parameter_string += ")";
                }
                if (i < usesAllocatorsAllocatorSequence->size()-1) {
                    parameter_string += ",";
                }
            }
            break;
            case OMPC_USESALLOCATORS_ALLOCATOR_low_lat: {
                parameter_string += "omp_low_lat_mem_alloc";
                if (usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray() != "") {
                    parameter_string += "(";
                    parameter_string += usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray();
                    parameter_string += ")";
                }
                if (i < usesAllocatorsAllocatorSequence->size()-1) {
                    parameter_string += ",";
                }
            }
            break;
            case OMPC_USESALLOCATORS_ALLOCATOR_cgroup: {
                parameter_string += "omp_cgroup_mem_alloc";
                if (usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray() != "") {
                    parameter_string += "(";
                    parameter_string += usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray();
                    parameter_string += ")";
                }
                if (i < usesAllocatorsAllocatorSequence->size()-1) {
                    parameter_string += ",";
                }
            }
            break;
            case OMPC_USESALLOCATORS_ALLOCATOR_pteam: {
                parameter_string += "omp_pteam_mem_alloc";
                if (usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray() != "") {
                    parameter_string += "(";
                    parameter_string += usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray();
                    parameter_string += ")";
                }
                if (i < usesAllocatorsAllocatorSequence->size()-1) {
                    parameter_string += ",";
                }
            }
            break;
            case OMPC_USESALLOCATORS_ALLOCATOR_thread: {
                parameter_string += "omp_thread_mem_alloc";
                if (usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray() != "") {
                    parameter_string += "(";
                    parameter_string += usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray();
                    parameter_string += ")";
                }
                if (i < usesAllocatorsAllocatorSequence->size()-1) {
                    parameter_string += ",";
                }
            }
            break;
            case OMPC_USESALLOCATORS_ALLOCATOR_user: {
                parameter_string += usesAllocatorsAllocatorSequence->at(i)->getAllocatorUser();
                if (usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray() != "") {
                    parameter_string += "(";
                    parameter_string += usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray();
                    parameter_string += ")";
                }
                if (i < usesAllocatorsAllocatorSequence->size()-1) {
                    parameter_string += ",";
                }
            }
            break;
            default:
                   ;
    }
}
    result += parameter_string;
    result += " ) ";
    return result;
}